

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O0

void injection::InjectionManager::bind_singleton<ITest,Test1>(void)

{
  function<ITest_*()> local_28;
  
  std::function<ITest*()>::function<Test1*(&)(),void>
            ((function<ITest*()> *)&local_28,injection_private::simple_maker<Test1>);
  bind<ITest>(&local_28,SINGLETON);
  std::function<ITest_*()>::~function(&local_28);
  return;
}

Assistant:

static void bind_singleton() {
        bind<I>(injection_private::simple_maker<C>, InjectionScope::SINGLETON);
    }